

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTupleTo<std::tuple<bool,bool,bool>,1ul>
               (tuple<bool,_bool,_bool> *t,ostream *param_2)

{
  __tuple_element_t<0UL,_tuple<bool,_bool,_bool>_> *value;
  ostream *os_local;
  tuple<bool,_bool,_bool> *t_local;
  
  PrintTupleTo<std::tuple<bool,bool,bool>>(t,param_2);
  value = std::get<0ul,bool,bool,bool>(t);
  UniversalPrinter<bool>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}